

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZROT::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZROT *this,double U,double V)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  ChVector<double> *v;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_60;
  double local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  peVar1 = (this->mnode1).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->mnode1).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_38 = *(undefined8 *)&peVar1->field_0x28;
    uStack_30 = *(undefined8 *)&peVar1->field_0x30;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    local_58 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_38 = *(undefined8 *)&peVar1->field_0x28;
    uStack_30 = *(undefined8 *)&peVar1->field_0x30;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->mnode2).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->mnode2).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_60 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_48 = *(undefined8 *)&peVar1->field_0x28;
    uStack_40 = *(undefined8 *)&peVar1->field_0x30;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    local_60 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    local_48 = *(undefined8 *)&peVar1->field_0x28;
    uStack_40 = *(undefined8 *)&peVar1->field_0x30;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->mnode3).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->mnode3).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar7 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    auVar9 = *(undefined1 (*) [16])&peVar1->field_0x28;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    dVar7 = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
    auVar9 = *(undefined1 (*) [16])&peVar1->field_0x28;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  auVar5._8_8_ = uStack_30;
  auVar5._0_8_ = local_38;
  auVar3._8_8_ = uStack_40;
  auVar3._0_8_ = local_48;
  auVar4 = vsubpd_avx(auVar3,auVar5);
  auVar5 = vsubpd_avx(auVar9,auVar5);
  auVar9 = vshufpd_avx(auVar4,auVar4,1);
  auVar3 = vshufpd_avx(auVar5,auVar5,1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar5._0_8_ * auVar9._0_8_;
  auVar14 = vfmsub231sd_fma(auVar14,auVar4,auVar3);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7 - local_58;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar3._0_8_ * (local_60 - local_58);
  auVar9 = vfmsub231sd_fma(auVar13,auVar11,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_60 - local_58;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (dVar7 - local_58) * auVar4._0_8_;
  auVar3 = vfmsub231sd_fma(auVar10,auVar8,auVar5);
  dVar12 = auVar9._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar12 * dVar12;
  auVar9 = vfmadd231sd_fma(auVar9,auVar14,auVar14);
  auVar9 = vfmadd231sd_fma(auVar9,auVar3,auVar3);
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  bVar6 = 2.2250738585072014e-308 <= auVar9._0_8_;
  dVar7 = 1.0 / auVar9._0_8_;
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar6 * (long)(auVar14._0_8_ * dVar7) + (ulong)!bVar6 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)bVar6 * (long)(dVar12 * dVar7));
  __return_storage_ptr__->m_data[2] = (double)((ulong)bVar6 * (long)(auVar3._0_8_ * dVar7));
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactTriangleXYZROT::ComputeNormal(const double U, const double V) {
    ChVector<> p0 = GetNode1()->GetPos();
    ChVector<> p1 = GetNode2()->GetPos();
    ChVector<> p2 = GetNode3()->GetPos();
    return Vcross(p1 - p0, p2 - p0).GetNormalized();
}